

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_animators.cpp
# Opt level: O0

void delete_all_parts(Am_Object *interp)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Object local_28;
  Am_Object obj;
  Am_Value_List new_objs;
  Am_Object *interp_local;
  
  pAVar2 = Am_Object::Get(interp,0x82,0);
  Am_Value_List::Am_Value_List((Am_Value_List *)&obj,pAVar2);
  Am_Object::Am_Object(&local_28);
  Am_Value_List::Start((Am_Value_List *)&obj);
  while( true ) {
    bVar1 = Am_Value_List::Last((Am_Value_List *)&obj);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pAVar2 = Am_Value_List::Get((Am_Value_List *)&obj);
    Am_Object::operator=(&local_28,pAVar2);
    Am_Object::Remove_From_Owner(&local_28);
    Am_Value_List::Next((Am_Value_List *)&obj);
  }
  Am_Object::~Am_Object(&local_28);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&obj);
  return;
}

Assistant:

void
delete_all_parts(Am_Object &interp)
{
  Am_Value_List new_objs = interp.Get(Am_GRAPHICAL_PARTS);
  //std::cout << "DONE ALL, destroying " << new_objs <<std::endl <<std::flush;
  Am_Object obj;
  for (new_objs.Start(); !new_objs.Last(); new_objs.Next()) {
    obj = new_objs.Get();
    // obj.Destroy(); BUG
    obj.Remove_From_Owner();
  }
}